

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecc-ssh.c
# Opt level: O0

void ecdsa_sign(ssh_key *key,ptrlen data,uint flags,BinarySink *bs)

{
  ssh_key *psVar1;
  mp_int *pmVar2;
  mp_int *x_00;
  mp_int *pmVar3;
  mp_int *x_01;
  strbuf *buf;
  strbuf *substr;
  mp_int *s;
  mp_int *kInv;
  mp_int *numerator;
  mp_int *rPriv;
  mp_int *r;
  mp_int *x;
  WeierstrassPoint *kG;
  uchar digest [20];
  mp_int *k;
  mp_int *z;
  ecsign_extra *extra;
  ecdsa_key *ek;
  BinarySink *bs_local;
  uint flags_local;
  ssh_key *key_local;
  ptrlen data_local;
  
  psVar1 = key + -3;
  if (key[-1].vt != (ssh_keyalg *)0x0) {
    pmVar2 = ecdsa_signing_exponent_from_data
                       ((ec_curve *)psVar1->vt,(ecsign_extra *)key->vt->extra,data);
    hash_simple(&ssh_sha1,data,&kG);
    register0x00000000 =
         dsa_gen_k("ECDSA deterministic k generator",(mp_int *)psVar1->vt->private_blob,
                   (mp_int *)key[-1].vt,(uchar *)&kG,0x14);
    x = (mp_int *)
        ecc_weierstrass_multiply((WeierstrassPoint *)psVar1->vt->public_blob,register0x00000000);
    ecc_weierstrass_get_affine((WeierstrassPoint *)x,&r,(mp_int **)0x0);
    ecc_weierstrass_point_free((WeierstrassPoint *)x);
    x_00 = mp_mod(r,(mp_int *)psVar1->vt->private_blob);
    mp_free(r);
    pmVar3 = mp_modmul(x_00,(mp_int *)key[-1].vt,(mp_int *)psVar1->vt->private_blob);
    x_01 = mp_modadd(pmVar2,pmVar3,(mp_int *)psVar1->vt->private_blob);
    mp_free(pmVar2);
    mp_free(pmVar3);
    pmVar2 = mp_invert(stack0xffffffffffffffb0,(mp_int *)psVar1->vt->private_blob);
    mp_free(stack0xffffffffffffffb0);
    pmVar3 = mp_modmul(x_01,pmVar2,(mp_int *)psVar1->vt->private_blob);
    mp_free(x_01);
    mp_free(pmVar2);
    BinarySink_put_stringz(bs->binarysink_,key->vt->ssh_id);
    buf = strbuf_new();
    BinarySink_put_mp_ssh2(buf->binarysink_,x_00);
    BinarySink_put_mp_ssh2(buf->binarysink_,pmVar3);
    BinarySink_put_stringsb(bs->binarysink_,buf);
    mp_free(x_00);
    mp_free(pmVar3);
    return;
  }
  __assert_fail("ek->privateKey",
                "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/crypto/ecc-ssh.c"
                ,0x462,"void ecdsa_sign(ssh_key *, ptrlen, unsigned int, BinarySink *)");
}

Assistant:

static void ecdsa_sign(ssh_key *key, ptrlen data,
                       unsigned flags, BinarySink *bs)
{
    struct ecdsa_key *ek = container_of(key, struct ecdsa_key, sshk);
    const struct ecsign_extra *extra =
        (const struct ecsign_extra *)ek->sshk.vt->extra;
    assert(ek->privateKey);

    mp_int *z = ecdsa_signing_exponent_from_data(ek->curve, extra, data);

    /* Generate k between 1 and curve->n, using the same deterministic
     * k generation system we use for conventional DSA. */
    mp_int *k;
    {
        unsigned char digest[20];
        hash_simple(&ssh_sha1, data, digest);
        k = dsa_gen_k(
            "ECDSA deterministic k generator", ek->curve->w.G_order,
            ek->privateKey, digest, sizeof(digest));
    }

    WeierstrassPoint *kG = ecc_weierstrass_multiply(ek->curve->w.G, k);
    mp_int *x;
    ecc_weierstrass_get_affine(kG, &x, NULL);
    ecc_weierstrass_point_free(kG);

    /* r = kG.x mod order(G) */
    mp_int *r = mp_mod(x, ek->curve->w.G_order);
    mp_free(x);

    /* s = (z + r * priv)/k mod n */
    mp_int *rPriv = mp_modmul(r, ek->privateKey, ek->curve->w.G_order);
    mp_int *numerator = mp_modadd(z, rPriv, ek->curve->w.G_order);
    mp_free(z);
    mp_free(rPriv);
    mp_int *kInv = mp_invert(k, ek->curve->w.G_order);
    mp_free(k);
    mp_int *s = mp_modmul(numerator, kInv, ek->curve->w.G_order);
    mp_free(numerator);
    mp_free(kInv);

    /* Format the output */
    put_stringz(bs, ek->sshk.vt->ssh_id);

    strbuf *substr = strbuf_new();
    put_mp_ssh2(substr, r);
    put_mp_ssh2(substr, s);
    put_stringsb(bs, substr);

    mp_free(r);
    mp_free(s);
}